

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d717::VectorMerge<sptk::int24_t>::Run
          (VectorMerge<sptk::int24_t> *this,istream *input_stream,istream *insert_stream,
          bool *eof_reached)

{
  __normal_iterator<const_sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
  __first;
  int_type iVar1;
  int iVar2;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *sequence_to_write;
  int *actual_write_size;
  long in_RCX;
  long in_RDI;
  __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
  __result;
  bool bVar3;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> garbage;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> merged_vector;
  vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *in_stack_fffffffffffffef8;
  difference_type in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  size_type in_stack_ffffffffffffff18;
  __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
  in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ostream *output_stream;
  undefined1 *puVar4;
  iterator in_stack_ffffffffffffff68;
  __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
  in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff80;
  ostream local_71;
  int *in_stack_ffffffffffffff90;
  undefined1 local_41 [25];
  long local_28;
  byte local_1;
  
  if (((*(byte *)(in_RDI + 0x20) & 1) == 0) || ((*(byte *)(in_RDI + 0x21) & 1) != 0)) {
    sequence_to_write =
         (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)(long)*(int *)(in_RDI + 0x14);
    puVar4 = local_41;
    local_28 = in_RCX;
    std::allocator<sptk::int24_t>::allocator((allocator<sptk::int24_t> *)0x1091a2);
    std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::vector
              ((vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
               (allocator_type *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::allocator<sptk::int24_t>::~allocator((allocator<sptk::int24_t> *)0x1091c8);
    actual_write_size = (int *)(long)*(int *)(in_RDI + 0x1c);
    output_stream = &local_71;
    std::allocator<sptk::int24_t>::allocator((allocator<sptk::int24_t> *)0x1091e8);
    std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::vector
              ((vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
               (allocator_type *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::allocator<sptk::int24_t>::~allocator((allocator<sptk::int24_t> *)0x10920e);
    do {
      if (0 < *(int *)(in_RDI + 8)) {
        in_stack_fffffffffffffef8 = (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)0x0;
        in_stack_ffffffffffffff2f =
             sptk::ReadStream<sptk::int24_t>
                       (SUB81((ulong)in_stack_ffffffffffffff80._M_current >> 0x30,0),
                        (int)in_stack_ffffffffffffff80._M_current,
                        (int)((ulong)in_stack_ffffffffffffff78._M_current >> 0x20),
                        (int)in_stack_ffffffffffffff78._M_current,
                        (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
                        in_stack_ffffffffffffff70._M_current,
                        (istream *)in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff90);
        if ((bool)in_stack_ffffffffffffff2f) goto LAB_001092d4;
LAB_001094a0:
        if (local_28 != 0) {
          in_stack_ffffffffffffff10 = std::istream::peek();
          iVar1 = std::char_traits<char>::eof();
          bVar3 = false;
          if (in_stack_ffffffffffffff10 == iVar1) {
            iVar2 = std::istream::peek();
            iVar1 = std::char_traits<char>::eof();
            bVar3 = iVar2 == iVar1;
          }
          *(bool *)local_28 = bVar3;
        }
        local_1 = 1;
        goto LAB_0010951c;
      }
LAB_001092d4:
      if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
        in_stack_fffffffffffffef8 = (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)0x0;
        in_stack_ffffffffffffff17 =
             sptk::ReadStream<sptk::int24_t>
                       (SUB81((ulong)in_stack_ffffffffffffff80._M_current >> 0x30,0),
                        (int)in_stack_ffffffffffffff80._M_current,
                        (int)((ulong)in_stack_ffffffffffffff78._M_current >> 0x20),
                        (int)in_stack_ffffffffffffff78._M_current,
                        (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
                        in_stack_ffffffffffffff70._M_current,
                        (istream *)in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff90);
        if (!(bool)in_stack_ffffffffffffff17) goto LAB_001094a0;
      }
      else {
        __result._M_current = (int24_t *)(in_RDI + 0x28);
        in_stack_ffffffffffffff80 =
             std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::begin
                       (in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff78 =
             std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::end
                       (in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff68 =
             std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::begin
                       (in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff70 =
             __gnu_cxx::
             __normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
             ::operator+((__normal_iterator<sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         in_stack_ffffffffffffff00);
        __first._M_current._7_1_ = in_stack_ffffffffffffff2f;
        __first._M_current._0_7_ = in_stack_ffffffffffffff28;
        in_stack_ffffffffffffff20 =
             std::
             copy<__gnu_cxx::__normal_iterator<sptk::int24_t_const*,std::vector<sptk::int24_t,std::allocator<sptk::int24_t>>>,__gnu_cxx::__normal_iterator<sptk::int24_t*,std::vector<sptk::int24_t,std::allocator<sptk::int24_t>>>>
                       (__first,(__normal_iterator<const_sptk::int24_t_*,_std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>_>
                                 )in_stack_ffffffffffffff20._M_current,__result);
      }
      iVar2 = (int)((ulong)in_stack_ffffffffffffff78._M_current >> 0x20);
      bVar3 = SUB81((ulong)in_stack_ffffffffffffff80._M_current >> 0x30,0);
      if (*(int *)(in_RDI + 0x18) < 1) {
        if (0 < *(int *)(in_RDI + 0x1c)) {
          in_stack_fffffffffffffef8 = (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)0x0;
          in_stack_ffffffffffffff15 =
               sptk::ReadStream<sptk::int24_t>
                         (bVar3,(int)in_stack_ffffffffffffff80._M_current,iVar2,
                          (int)in_stack_ffffffffffffff78._M_current,
                          (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
                          in_stack_ffffffffffffff70._M_current,
                          (istream *)in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff90)
          ;
          bVar3 = (bool)in_stack_ffffffffffffff15;
          goto joined_r0x0010944b;
        }
      }
      else {
        in_stack_fffffffffffffef8 = (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)0x0;
        in_stack_ffffffffffffff16 =
             sptk::ReadStream<sptk::int24_t>
                       (bVar3,(int)in_stack_ffffffffffffff80._M_current,iVar2,
                        (int)in_stack_ffffffffffffff78._M_current,
                        (vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
                        in_stack_ffffffffffffff70._M_current,
                        (istream *)in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff90);
        bVar3 = (bool)in_stack_ffffffffffffff16;
joined_r0x0010944b:
        if (!bVar3) goto LAB_001094a0;
      }
      in_stack_ffffffffffffff14 =
           sptk::WriteStream<sptk::int24_t>
                     ((int)in_RDI,(int)((ulong)puVar4 >> 0x20),sequence_to_write,output_stream,
                      actual_write_size);
    } while ((bool)in_stack_ffffffffffffff14);
    local_1 = 0;
LAB_0010951c:
    std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::~vector
              ((vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
    std::vector<sptk::int24_t,_std::allocator<sptk::int24_t>_>::~vector
              ((vector<sptk::int24_t,_std::allocator<sptk::int24_t>_> *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT15(in_stack_ffffffffffffff15,
                                          CONCAT14(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10)))));
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Run(std::istream* input_stream, std::istream* insert_stream,
           bool* eof_reached) const override {
    if (recursive_ && !has_vector_) {
      return true;
    }

    std::vector<T> merged_vector(merged_length_);
    std::vector<T> garbage(input_skip_length_);
    for (;;) {
      if (0 < insert_point_) {
        if (!sptk::ReadStream(false, 0, 0, insert_point_, &merged_vector,
                              input_stream, NULL)) {
          break;
        }
      }
      if (recursive_) {
        std::copy(insert_vector_.begin(), insert_vector_.end(),
                  merged_vector.begin() + insert_point_);
      } else if (!sptk::ReadStream(false, 0, insert_point_, insert_length_,
                                   &merged_vector, insert_stream, NULL)) {
        break;
      }
      if (0 < input_rest_length_) {
        if (!sptk::ReadStream(
                false, input_skip_length_, insert_point_ + insert_length_,
                input_rest_length_, &merged_vector, input_stream, NULL)) {
          break;
        }
      } else if (0 < input_skip_length_) {
        if (!sptk::ReadStream(false, 0, 0, input_skip_length_, &garbage,
                              input_stream, NULL)) {
          break;
        }
      }
      if (!sptk::WriteStream(0, merged_length_, merged_vector, &std::cout,
                             NULL)) {
        return false;
      }
    }

    if (NULL != eof_reached) {
      *eof_reached =
          (input_stream->peek() == std::istream::traits_type::eof() &&
           insert_stream->peek() == std::istream::traits_type::eof());
    }
    return true;
  }